

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O2

void EpdPow2Decimal(int n,EpDouble *epd)

{
  double dVar1;
  EpDouble epd2;
  EpDouble epd1;
  EpDouble local_40;
  EpDouble local_30;
  
  if (n < 0x400) {
    dVar1 = ldexp(1.0,n);
    (epd->type).value = dVar1;
    epd->exponent = 0;
    EpdNormalizeDecimal(epd);
    return;
  }
  EpdPow2Decimal((uint)n >> 1,&local_30);
  EpdPow2Decimal(n - ((uint)n >> 1),&local_40);
  EpdMultiply3Decimal(&local_30,&local_40,epd);
  return;
}

Assistant:

void
EpdPow2Decimal(int n, EpDouble *epd)
{
  if (n <= EPD_MAX_BIN) {
    epd->type.value = pow((double)2.0, (double)n);
    epd->exponent = 0;
    EpdNormalizeDecimal(epd);
  } else {
    EpDouble    epd1, epd2;
    int         n1, n2;

    n1 = n / 2;
    n2 = n - n1;
    EpdPow2Decimal(n1, &epd1);
    EpdPow2Decimal(n2, &epd2);
    EpdMultiply3Decimal(&epd1, &epd2, epd);
  }
}